

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.h
# Opt level: O0

void __thiscall
cnn::LookupParameters::save<boost::archive::text_oarchive>
          (LookupParameters *this,text_oarchive *ar,uint param_3)

{
  interface_oarchive<boost::archive::text_oarchive> *this_00;
  interface_oarchive<boost::archive::text_oarchive> *piVar1;
  Tensor *in_RSI;
  long in_RDI;
  uint i;
  int nv;
  Dim *in_stack_ffffffffffffffc8;
  Tensor *t;
  interface_oarchive<boost::archive::text_oarchive> *in_stack_ffffffffffffffd0;
  undefined4 local_1c;
  
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
            ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30));
  boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&
            (in_stack_ffffffffffffffd0,(int *)in_stack_ffffffffffffffc8);
  local_1c = 0;
  while( true ) {
    this_00 = (interface_oarchive<boost::archive::text_oarchive> *)(ulong)local_1c;
    piVar1 = (interface_oarchive<boost::archive::text_oarchive> *)
             std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::size
                       ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30));
    if (piVar1 <= this_00) break;
    t = in_RSI;
    std::vector<cnn::Tensor,_std::allocator<cnn::Tensor>_>::operator[]
              ((vector<cnn::Tensor,_std::allocator<cnn::Tensor>_> *)(in_RDI + 0x30),(ulong)local_1c)
    ;
    boost::archive::detail::interface_oarchive<boost::archive::text_oarchive>::operator&(this_00,t);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void save(Archive& ar, const unsigned int) const {
    ar & dim;
    int nv = values.size();
    ar & nv;
    for (unsigned i = 0; i < values.size(); ++i)
      ar & values[i];
  }